

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerhand_test.cpp
# Opt level: O0

Utest * __thiscall
TEST_PlayerHandTest_LastDrawTile_TestShell::createTest
          (TEST_PlayerHandTest_LastDrawTile_TestShell *this)

{
  TEST_PlayerHandTest_LastDrawTile_Test *this_00;
  char *in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  TEST_PlayerHandTest_LastDrawTile_TestShell *this_local;
  
  this_00 = (TEST_PlayerHandTest_LastDrawTile_Test *)
            operator_new(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,0);
  TEST_PlayerHandTest_LastDrawTile_Test::TEST_PlayerHandTest_LastDrawTile_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(PlayerHandTest, LastDrawTile)
{
	h.add(Tile::OneOfCircles);
	CHECK(Tile::OneOfCircles == h.lastTile());

	h.add(Tile::TwoOfCircles);
	CHECK(Tile::TwoOfCircles == h.lastTile());
}